

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O2

interval_t duckdb::ToMinutesOperator::Operation<long,duckdb::interval_t>(long input)

{
  interval_t iVar1;
  bool bVar2;
  OutOfRangeException *this;
  allocator local_69;
  interval_t result;
  string local_58;
  string local_38;
  
  result.months = 0;
  result.days = 0;
  bVar2 = TryMultiplyOperator::Operation<long,long,long>(input,60000000,&result.micros);
  if (bVar2) {
    iVar1.micros = result.micros;
    iVar1.months = result.months;
    iVar1.days = result.days;
    return iVar1;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Interval value %s minutes out of range",&local_69);
  ::std::__cxx11::to_string(&local_58,input);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string>(this,&local_38,&local_58);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input) {
		interval_t result;
		result.months = 0;
		result.days = 0;
		if (!TryMultiplyOperator::Operation<TA, int64_t, int64_t>(input, Interval::MICROS_PER_MINUTE, result.micros)) {
			throw OutOfRangeException("Interval value %s minutes out of range", NumericHelper::ToString(input));
		}
		return result;
	}